

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QCss::PageRule>::emplace<QCss::PageRule_const&>
          (QMovableArrayOps<QCss::PageRule> *this,qsizetype i,PageRule *args)

{
  PageRule **ppPVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  PageRule local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.size
        == i) {
      qVar4 = QArrayDataPointer<QCss::PageRule>::freeSpaceAtEnd
                        ((QArrayDataPointer<QCss::PageRule> *)this);
      if (qVar4 == 0) goto LAB_0054d581;
      QCss::PageRule::PageRule
                ((this->super_QGenericArrayOps<QCss::PageRule>).
                 super_QArrayDataPointer<QCss::PageRule>.ptr +
                 (this->super_QGenericArrayOps<QCss::PageRule>).
                 super_QArrayDataPointer<QCss::PageRule>.size,args);
LAB_0054d670:
      pqVar2 = &(this->super_QGenericArrayOps<QCss::PageRule>).
                super_QArrayDataPointer<QCss::PageRule>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0054d62f;
    }
LAB_0054d581:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QCss::PageRule>::freeSpaceAtBegin
                        ((QArrayDataPointer<QCss::PageRule> *)this);
      if (qVar4 != 0) {
        QCss::PageRule::PageRule
                  ((this->super_QGenericArrayOps<QCss::PageRule>).
                   super_QArrayDataPointer<QCss::PageRule>.ptr + -1,args);
        ppPVar1 = &(this->super_QGenericArrayOps<QCss::PageRule>).
                   super_QArrayDataPointer<QCss::PageRule>.ptr;
        *ppPVar1 = *ppPVar1 + -1;
        goto LAB_0054d670;
      }
    }
  }
  local_58.declarations.d.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.declarations.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.selector.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.declarations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.selector.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.selector.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QCss::PageRule::PageRule(&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.
          size != 0;
  QArrayDataPointer<QCss::PageRule>::detachAndGrow
            ((QArrayDataPointer<QCss::PageRule> *)this,(uint)(i == 0 && bVar5),1,(PageRule **)0x0,
             (QArrayDataPointer<QCss::PageRule> *)0x0);
  if (i == 0 && bVar5) {
    QCss::PageRule::PageRule
              ((this->super_QGenericArrayOps<QCss::PageRule>).
               super_QArrayDataPointer<QCss::PageRule>.ptr + -1,&local_58);
    ppPVar1 = &(this->super_QGenericArrayOps<QCss::PageRule>).
               super_QArrayDataPointer<QCss::PageRule>.ptr;
    *ppPVar1 = *ppPVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>
              .size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QCss::PageRule> *)this,i,1);
    QCss::PageRule::PageRule(local_80.displaceFrom,&local_58);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QCss::PageRule::~PageRule(&local_58);
LAB_0054d62f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }